

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

int dump_callback(void *pArg,int nArg,char **azArg,char **azNotUsed)

{
  undefined4 uVar1;
  char *__s1;
  char *__s1_00;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  char **ppcVar5;
  undefined8 uVar6;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  RenderMode savedMode;
  char *savedDestTable;
  int i;
  char **azCol;
  string sTable;
  string sSelect;
  char *zIns;
  ShellState *p;
  char *zSql;
  char *zType;
  char *zTable;
  int rc;
  char *in_stack_fffffffffffffed8;
  char **in_stack_fffffffffffffee0;
  char cVar7;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  ShellState *in_stack_fffffffffffffef0;
  ShellState *text;
  char **in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  char in_stack_ffffffffffffff1f;
  ShellState *this;
  char *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  sqlite3 *in_stack_ffffffffffffff40;
  int local_a4;
  string local_98 [32];
  string local_78 [32];
  char *local_58;
  int local_4;
  
  if ((in_ESI != 3) || (in_RDX == (undefined8 *)0x0)) {
    return 0;
  }
  text = (ShellState *)*in_RDX;
  __s1 = (char *)in_RDX[1];
  __s1_00 = (char *)in_RDX[2];
  iVar3 = strcmp((char *)text,"sqlite_sequence");
  if (iVar3 == 0) {
    fprintf(*(FILE **)(in_RDI + 0x20),"DELETE FROM sqlite_sequence;\n");
  }
  else {
    iVar3 = duckdb_shell_sqlite3_strglob
                      ((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (iVar3 == 0) {
      fprintf(*(FILE **)(in_RDI + 0x20),"ANALYZE sqlite_schema;\n");
    }
    else {
      iVar3 = strncmp((char *)text,"sqlite_",7);
      if (iVar3 == 0) {
        return 0;
      }
      iVar3 = strncmp(__s1_00,"CREATE VIRTUAL TABLE",0x14);
      if (iVar3 == 0) {
        local_58 = duckdb_shell_sqlite3_mprintf
                             ("INSERT INTO sqlite_schema(type,name,tbl_name,rootpage,sql)VALUES(\'table\',\'%q\',\'%q\',0,\'%q\');"
                              ,text,text,__s1_00);
        fprintf(*(FILE **)(in_RDI + 0x20),"%s\n",local_58);
        duckdb_shell_sqlite3_free((void *)0x1dc13f);
        return 0;
      }
      duckdb_shell::ShellState::PrintSchemaLine
                (in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (char *)in_stack_fffffffffffffee0);
    }
  }
  iVar3 = strcmp(__s1,"table");
  if (iVar3 == 0) {
    std::__cxx11::string::string(local_78);
    std::__cxx11::string::string(local_98);
    ppcVar5 = duckdb_shell::ShellState::TableColumnList
                        ((ShellState *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                         ,in_stack_ffffffffffffff30);
    if (ppcVar5 == (char **)0x0) {
      *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
      local_4 = 0;
      iVar3 = 1;
    }
    else {
      this = text;
      quoteChar(in_stack_fffffffffffffed8);
      appendText((string *)in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
      if (*ppcVar5 != (char *)0x0) {
        appendText((string *)in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
        appendText((string *)in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
        for (local_a4 = 1; cVar7 = (char)((ulong)in_stack_fffffffffffffee0 >> 0x38),
            ppcVar5[local_a4] != (char *)0x0; local_a4 = local_a4 + 1) {
          appendText((string *)in_stack_fffffffffffffef0,
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),cVar7);
          in_stack_ffffffffffffff10 = (char **)ppcVar5[local_a4];
          in_stack_ffffffffffffff1f = quoteChar(in_stack_fffffffffffffed8);
          appendText((string *)in_stack_fffffffffffffef0,
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
        }
        appendText((string *)in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),cVar7);
      }
      appendText((string *)in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
      if (*ppcVar5 != (char *)0x0) {
        appendText((string *)in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
        appendText((string *)in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
      }
      for (local_a4 = 1; ppcVar5[local_a4] != (char *)0x0; local_a4 = local_a4 + 1) {
        quoteChar(in_stack_fffffffffffffed8);
        appendText((string *)in_stack_fffffffffffffef0,
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
        if (ppcVar5[local_a4 + 1] != (char *)0x0) {
          appendText((string *)in_stack_fffffffffffffef0,
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     (char)((ulong)in_stack_fffffffffffffee0 >> 0x38));
        }
      }
      freeColumnList(in_stack_fffffffffffffee0);
      cVar7 = (char)((ulong)in_stack_fffffffffffffee0 >> 0x38);
      appendText((string *)in_stack_fffffffffffffef0,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),cVar7);
      quoteChar(in_stack_fffffffffffffed8);
      appendText((string *)text,
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),cVar7);
      uVar2 = *(undefined8 *)(in_RDI + 0x50);
      uVar1 = *(undefined4 *)(in_RDI + 0x2c);
      uVar6 = std::__cxx11::string::c_str();
      *(undefined8 *)(in_RDI + 0x50) = uVar6;
      *(undefined4 *)(in_RDI + 0x34) = 5;
      *(undefined4 *)(in_RDI + 0x2c) = 5;
      std::__cxx11::string::c_str();
      uVar4 = duckdb_shell::ShellState::ExecuteSQL
                        (this,(char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                         in_stack_ffffffffffffff10);
      if ((uVar4 & 0xff) == 0xb) {
        fprintf(*(FILE **)(in_RDI + 0x20),"/****** CORRUPTION ERROR *******/\n");
        toggleSelectOrder(in_stack_ffffffffffffff40);
        std::__cxx11::string::c_str();
        duckdb_shell::ShellState::ExecuteSQL
                  (this,(char *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
                   in_stack_ffffffffffffff10);
        toggleSelectOrder(in_stack_ffffffffffffff40);
      }
      *(undefined8 *)(in_RDI + 0x50) = uVar2;
      *(undefined4 *)(in_RDI + 0x2c) = uVar1;
      if (uVar4 != 0) {
        *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
      }
      iVar3 = 0;
    }
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_78);
    if (iVar3 != 0) {
      return local_4;
    }
  }
  return 0;
}

Assistant:

static int dump_callback(void *pArg, int nArg, char **azArg, char **azNotUsed) {
	int rc;
	const char *zTable;
	const char *zType;
	const char *zSql;
	ShellState *p = (ShellState *)pArg;

	UNUSED_PARAMETER(azNotUsed);
	if (nArg != 3 || azArg == 0)
		return 0;
	zTable = azArg[0];
	zType = azArg[1];
	zSql = azArg[2];

	if (strcmp(zTable, "sqlite_sequence") == 0) {
		raw_printf(p->out, "DELETE FROM sqlite_sequence;\n");
	} else if (sqlite3_strglob("sqlite_stat?", zTable) == 0) {
		raw_printf(p->out, "ANALYZE sqlite_schema;\n");
	} else if (strncmp(zTable, "sqlite_", 7) == 0) {
		return 0;
	} else if (strncmp(zSql, "CREATE VIRTUAL TABLE", 20) == 0) {
		char *zIns;
		zIns = sqlite3_mprintf("INSERT INTO sqlite_schema(type,name,tbl_name,rootpage,sql)"
		                       "VALUES('table','%q','%q',0,'%q');",
		                       zTable, zTable, zSql);
		utf8_printf(p->out, "%s\n", zIns);
		sqlite3_free(zIns);
		return 0;
	} else {
		p->PrintSchemaLine(zSql, ";\n");
	}

	if (strcmp(zType, "table") == 0) {
		string sSelect;
		string sTable;
		char **azCol;
		int i;
		char *savedDestTable;
		RenderMode savedMode;

		azCol = p->TableColumnList(zTable);
		if (azCol == 0) {
			p->nErr++;
			return 0;
		}

		/* Always quote the table name, even if it appears to be pure ascii,
		** in case it is a keyword. Ex:  INSERT INTO "table" ... */
		appendText(sTable, zTable, quoteChar(zTable));
		/* If preserving the rowid, add a column list after the table name.
		** In other words:  "INSERT INTO tab(rowid,a,b,c,...) VALUES(...)"
		** instead of the usual "INSERT INTO tab VALUES(...)".
		*/
		if (azCol[0]) {
			appendText(sTable, "(", 0);
			appendText(sTable, azCol[0], 0);
			for (i = 1; azCol[i]; i++) {
				appendText(sTable, ",", 0);
				appendText(sTable, azCol[i], quoteChar(azCol[i]));
			}
			appendText(sTable, ")", 0);
		}

		/* Build an appropriate SELECT statement */
		appendText(sSelect, "SELECT ", 0);
		if (azCol[0]) {
			appendText(sSelect, azCol[0], 0);
			appendText(sSelect, ",", 0);
		}
		for (i = 1; azCol[i]; i++) {
			appendText(sSelect, azCol[i], quoteChar(azCol[i]));
			if (azCol[i + 1]) {
				appendText(sSelect, ",", 0);
			}
		}
		freeColumnList(azCol);
		appendText(sSelect, " FROM ", 0);
		appendText(sSelect, zTable, quoteChar(zTable));

		savedDestTable = p->zDestTable;
		savedMode = p->mode;
		p->zDestTable = (char *)sTable.c_str();
		p->mode = p->cMode = RenderMode::INSERT;
		rc = p->ExecuteSQL(sSelect.c_str(), 0);
		if ((rc & 0xff) == SQLITE_CORRUPT) {
			raw_printf(p->out, "/****** CORRUPTION ERROR *******/\n");
			toggleSelectOrder(p->db);
			p->ExecuteSQL(sSelect.c_str(), 0);
			toggleSelectOrder(p->db);
		}
		p->zDestTable = savedDestTable;
		p->mode = savedMode;
		if (rc)
			p->nErr++;
	}
	return 0;
}